

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall LINSimulationDataGenerator::SwapEnds(LINSimulationDataGenerator *this,U8 *byte)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  
  iVar1 = 7;
  bVar3 = 0;
  do {
    bVar2 = (byte)iVar1;
    bVar4 = iVar1 != 0;
    iVar1 = iVar1 + -1;
    bVar3 = (byte)((*byte >> (bVar2 & 0x1f)) << 7 | bVar3) >> bVar4;
  } while (iVar1 != -1);
  *byte = bVar3;
  return;
}

Assistant:

void LINSimulationDataGenerator::SwapEnds( U8& byte )
{
    U8 t = 0;
    for( int n = 7; n >= 0; n-- )
    {
        t |= ( ( byte >> n ) & 1 ) << 7;
        if( n )
            t >>= 1;
    }
    byte = t;
}